

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMemoryAllocatorTest.cpp
# Opt level: O2

Utest * __thiscall
TEST_GlobalMemoryAccountant_stop_TestShell::createTest
          (TEST_GlobalMemoryAccountant_stop_TestShell *this)

{
  TEST_GlobalMemoryAccountant_stop_Test *this_00;
  
  this_00 = (TEST_GlobalMemoryAccountant_stop_Test *)
            operator_new(0x98,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/TestMemoryAllocatorTest.cpp"
                         ,0x28f);
  TEST_GlobalMemoryAccountant_stop_Test::TEST_GlobalMemoryAccountant_stop_Test(this_00);
  return (Utest *)this_00;
}

Assistant:

TEST(GlobalMemoryAccountant, stop)
{
    TestMemoryAllocator* originalMallocAllocator = getCurrentMallocAllocator();
    TestMemoryAllocator* originalNewAllocator = getCurrentNewAllocator();
    TestMemoryAllocator* originalNewArrayAllocator = getCurrentNewArrayAllocator();

    accountant.start();
    accountant.stop();

    POINTERS_EQUAL(originalMallocAllocator, getCurrentMallocAllocator());
    POINTERS_EQUAL(originalNewAllocator, getCurrentNewAllocator());
    POINTERS_EQUAL(originalNewArrayAllocator, getCurrentNewArrayAllocator());
}